

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O3

void __thiscall
TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap
          (TLeonardoHeap<smoothsort_ptr<double>_> *this,smoothsort_ptr<double> *_data,size_t _N)

{
  ulong uVar1;
  unsigned_short uVar2;
  size_t current;
  size_t sVar3;
  
  this->data = _data;
  this->N = _N;
  this->tree_vector = 3;
  this->first_tree = 0;
  if ((1 < _N) && (_N != 2)) {
    uVar1 = 3;
    sVar3 = 2;
    uVar2 = 0;
    do {
      if ((~(uint)uVar1 & 3) == 0) {
        uVar1 = uVar1 >> 2 | 1;
        this->tree_vector = uVar1;
        uVar2 = uVar2 + 2;
      }
      else if (uVar2 == 1) {
        uVar1 = uVar1 * 2 + 1;
        this->tree_vector = uVar1;
        uVar2 = 0;
      }
      else {
        uVar1 = uVar1 << ((char)uVar2 - 1U & 0x3f) | 1;
        this->tree_vector = uVar1;
        uVar2 = 1;
      }
      sVar3 = sVar3 + 1;
    } while (_N != sVar3);
    this->first_tree = uVar2;
  }
  return;
}

Assistant:

TLeonardoHeap<T>::TLeonardoHeap(T* _data, size_t _N) : data(_data) , N(_N) {
	// Initialize the heap with the first two elements
	tree_vector = 3;
	first_tree = 0;
	if(N > 1) { if(data[0] > data[1]) { swap(0, 1); } }
	// Insert each element sequentially
	for(size_t i=2; i<N; i++) { insertion_sort(i); }
}